

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O1

void google::protobuf::compiler::cpp::AddAccessorAnnotations
               (FieldDescriptor *descriptor,Options *options,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  int iVar1;
  pointer pcVar2;
  StringPiece prepared_template_00;
  StringPiece prepared_template_01;
  StringPiece prepared_template_02;
  StringPiece prepared_template_03;
  StringPiece prepared_template_04;
  StringPiece prepared_template_05;
  StringPiece prepared_template_06;
  StringPiece prepared_template_07;
  StringPiece prepared_template_08;
  StringPiece prepared_template_09;
  StringPiece prepared_template_10;
  StringPiece access_type;
  StringPiece access_type_00;
  StringPiece access_type_01;
  StringPiece access_type_02;
  StringPiece access_type_03;
  StringPiece access_type_04;
  StringPiece access_type_05;
  StringPiece access_type_06;
  StringPiece access_type_07;
  StringPiece access_type_08;
  StringPiece access_type_09;
  StringPiece substitute_template_prefix_00;
  StringPiece substitute_template_prefix_01;
  StringPiece substitute_template_prefix_02;
  StringPiece substitute_template_prefix_03;
  StringPiece substitute_template_prefix_04;
  StringPiece substitute_template_prefix_05;
  StringPiece substitute_template_prefix_06;
  StringPiece substitute_template_prefix_07;
  StringPiece substitute_template_prefix_08;
  StringPiece substitute_template_prefix_09;
  StringPiece substitute_template_prefix_10;
  size_type sVar3;
  undefined4 uVar4;
  bool bVar5;
  mapped_type *pmVar6;
  long *plVar7;
  undefined1 *b;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *pFVar8;
  char *pcVar9;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  char *pcVar10;
  string *psVar11;
  _Alloc_hider _Var12;
  long lVar13;
  StringPiece annotation_name;
  StringPiece annotation_name_00;
  StringPiece annotation_name_01;
  StringPiece annotation_name_02;
  StringPiece annotation_name_03;
  StringPiece annotation_name_04;
  StringPiece annotation_name_05;
  StringPiece annotation_name_06;
  StringPiece annotation_name_07;
  StringPiece annotation_name_08;
  StringPiece annotation_name_09;
  StringPiece field_member_00;
  AlphaNum *pAVar14;
  AlphaNum *e;
  string substitute_template_prefix;
  undefined1 local_610 [48];
  string prepared_template;
  string field_member;
  string prepared_flat_template;
  AlphaNum local_580;
  string prepared_add_template;
  undefined1 local_530 [48];
  AlphaNum local_500;
  AlphaNum local_4d0;
  AlphaNum local_4a0;
  char *local_470;
  size_type sStack_468;
  char *local_460;
  size_type sStack_458;
  char *local_450;
  size_type sStack_448;
  char *local_440;
  size_type sStack_438;
  char *local_430;
  size_type sStack_428;
  char *local_420;
  size_type sStack_418;
  char *local_410;
  size_type sStack_408;
  char *local_400;
  size_type sStack_3f8;
  char *local_3f0;
  size_type sStack_3e8;
  char *local_3e0;
  size_type sStack_3d8;
  char *local_3d0;
  size_type sStack_3c8;
  AlphaNum local_3c0;
  key_type local_390;
  string proto_ns;
  string field_pointer;
  SubstituteArg local_280;
  string default_value_pointer;
  SubstituteArg local_230;
  AlphaNum local_200;
  string field_name;
  string local_1b0;
  string local_190;
  string local_170;
  SubstituteArg local_150;
  SubstituteArg local_120;
  AlphaNum local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  lVar13 = 0;
  do {
    std::__cxx11::string::string
              ((string *)local_610,
               *(char **)((long)AddAccessorAnnotations::kAccessorsAnnotations + lVar13),
               (allocator *)&local_580);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_610);
    pAVar14 = (AlphaNum *)0x0;
    std::__cxx11::string::_M_replace((ulong)pmVar6,0,(char *)pmVar6->_M_string_length,0x3e25d9);
    pFVar8 = extraout_RDX;
    if ((undefined1 *)local_610._0_8_ != local_610 + 0x10) {
      operator_delete((void *)local_610._0_8_);
      pFVar8 = extraout_RDX_00;
    }
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x58);
  if (options->annotate_accessor == true) {
    lVar13 = 0;
    do {
      local_610._0_8_ = "  ";
      local_610._8_8_ = 2;
      FieldName_abi_cxx11_((string *)&local_4d0,(cpp *)descriptor,pFVar8);
      local_580.piece_data_ = local_4d0.piece_data_;
      local_580.piece_size_ = local_4d0.piece_size_;
      local_500.piece_data_ = "_AccessedNoStrip = true;\n";
      local_500.piece_size_ = 0x19;
      StrCat_abi_cxx11_((string *)&local_4a0,(protobuf *)local_610,&local_580,&local_500,pAVar14);
      std::__cxx11::string::string
                ((string *)&local_3c0,
                 *(char **)((long)AddAccessorAnnotations::kAccessorsAnnotations + lVar13),
                 (allocator *)&local_200);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_3c0);
      std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_4a0);
      pFVar8 = extraout_RDX_01;
      if (local_3c0.piece_data_ != local_3c0.digits) {
        operator_delete(local_3c0.piece_data_);
        pFVar8 = extraout_RDX_02;
      }
      if (local_4a0.piece_data_ != local_4a0.digits) {
        operator_delete(local_4a0.piece_data_);
        pFVar8 = extraout_RDX_03;
      }
      if (local_4d0.piece_data_ != local_4d0.digits) {
        operator_delete(local_4d0.piece_data_);
        pFVar8 = extraout_RDX_04;
      }
      lVar13 = lVar13 + 8;
    } while (lVar13 != 0x58);
  }
  if ((options->field_listener_options).inject_field_listener_events != true) {
    return;
  }
  if (*(int *)(*(long *)(*(long *)(descriptor + 0x10) + 0x78) + 0xa0) == 3) {
    return;
  }
  local_610._0_8_ = local_610 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"field_member","");
  e = (AlphaNum *)variables;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_610);
  field_member._M_dataplus._M_p = (pointer)&field_member.field_2;
  pcVar2 = (pmVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&field_member,pcVar2,pcVar2 + pmVar6->_M_string_length);
  if ((undefined1 *)local_610._0_8_ != local_610 + 0x10) {
    operator_delete((void *)local_610._0_8_);
  }
  lVar13 = *(long *)(descriptor + 0x28);
  if (lVar13 == 0 || ((byte)descriptor[1] & 0x10) == 0) {
    lVar13 = 0;
  }
  else if ((*(int *)(lVar13 + 4) == 1) && ((*(byte *)(*(long *)(lVar13 + 0x20) + 1) & 2) != 0)) {
    lVar13 = 0;
  }
  if (lVar13 != 0) {
    local_610._0_8_ = **(undefined8 **)(lVar13 + 8);
    local_610._8_8_ = (*(undefined8 **)(lVar13 + 8))[1];
    local_580.piece_data_ = "_.";
    local_580.piece_size_ = 2;
    local_500.piece_size_ =
         CONCAT44(field_member._M_string_length._4_4_,(undefined4)field_member._M_string_length);
    local_500.piece_data_ = field_member._M_dataplus._M_p;
    StrCat_abi_cxx11_((string *)&local_4a0,(protobuf *)local_610,&local_580,&local_500,pAVar14);
    std::__cxx11::string::operator=((string *)&field_member,(string *)&local_4a0);
    if (local_4a0.piece_data_ != local_4a0.digits) {
      operator_delete(local_4a0.piece_data_);
    }
  }
  local_610._0_8_ = local_610 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"proto_ns","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_610);
  proto_ns._M_dataplus._M_p = (pointer)&proto_ns.field_2;
  pcVar2 = (pmVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&proto_ns,pcVar2,pcVar2 + pmVar6->_M_string_length);
  if ((undefined1 *)local_610._0_8_ != local_610 + 0x10) {
    operator_delete((void *)local_610._0_8_);
  }
  substitute_template_prefix._M_dataplus._M_p = (pointer)&substitute_template_prefix.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&substitute_template_prefix,"  _tracker_.$1<$0>(this, ","");
  prepared_template._M_dataplus._M_p = (pointer)&prepared_template.field_2;
  prepared_template._M_string_length = 0;
  prepared_template.field_2._M_local_buf[0] = '\0';
  prepared_flat_template._M_dataplus._M_p = (pointer)&prepared_flat_template.field_2;
  prepared_flat_template._M_string_length = 0;
  prepared_flat_template.field_2._M_local_buf[0] = '\0';
  prepared_add_template._M_dataplus._M_p = (pointer)&prepared_add_template.field_2;
  prepared_add_template._M_string_length = 0;
  prepared_add_template.field_2._M_local_buf[0] = '\0';
  if ((~(byte)descriptor[1] & 0x60) == 0) {
    if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
      local_610._0_8_ = FieldDescriptor::TypeOnceInit;
      local_580.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_610,
                 (FieldDescriptor **)&local_580);
    }
    if ((descriptor[2] == (FieldDescriptor)0xb) &&
       (bVar5 = FieldDescriptor::is_map_message_type(descriptor), bVar5)) goto LAB_002e294d;
    if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
      local_610._0_8_ = FieldDescriptor::TypeOnceInit;
      local_580.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_610,
                 (FieldDescriptor **)&local_580);
    }
    if (descriptor[2] != (FieldDescriptor)0xb) {
      if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
        local_610._0_8_ = FieldDescriptor::TypeOnceInit;
        local_580.piece_data_ = (char *)descriptor;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_610,
                   (FieldDescriptor **)&local_580);
      }
      if (descriptor[2] == (FieldDescriptor)0xa) goto LAB_002e2cb0;
      local_530._0_8_ = local_530 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"&$0.Get(index)","");
      local_610._0_8_ = field_member._M_dataplus._M_p;
      local_610._8_4_ = (undefined4)field_member._M_string_length;
      local_580.piece_data_ = (char *)0x0;
      local_580.piece_size_ = CONCAT44(local_580.piece_size_._4_4_,0xffffffff);
      local_500.piece_data_ = (char *)0x0;
      local_500.piece_size_ = CONCAT44(local_500.piece_size_._4_4_,0xffffffff);
      local_4a0.piece_data_ = (char *)0x0;
      local_4a0.piece_size_ = CONCAT44(local_4a0.piece_size_._4_4_,0xffffffff);
      local_4d0.piece_data_ = (char *)0x0;
      local_4d0.piece_size_ = CONCAT44(local_4d0.piece_size_._4_4_,0xffffffff);
      local_3c0.piece_data_ = (char *)0x0;
      local_3c0.piece_size_ = CONCAT44(local_3c0.piece_size_._4_4_,0xffffffff);
      local_200.piece_data_ = (char *)0x0;
      local_200.piece_size_._0_4_ = 0xffffffff;
      local_f0.piece_data_ = (char *)0x0;
      local_f0.piece_size_._0_4_ = 0xffffffff;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute((string *)&local_230,(string *)local_530,(SubstituteArg *)local_610,
                          (SubstituteArg *)&local_580,(SubstituteArg *)&local_500,
                          (SubstituteArg *)&local_4a0,(SubstituteArg *)&local_4d0,
                          (SubstituteArg *)&local_3c0,(SubstituteArg *)&local_200,
                          (SubstituteArg *)&local_f0,&local_120,&local_150);
      std::__cxx11::string::operator=((string *)&prepared_template,(string *)&local_230);
      if (local_230.text_ != local_230.scratch_ + 4) {
        operator_delete(local_230.text_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_530 + 0x10)) {
        operator_delete((void *)local_530._0_8_);
      }
      local_530._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_530 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_530,"&$0.Get($0.size() - 1)","");
      local_610._0_8_ = field_member._M_dataplus._M_p;
      local_610._8_4_ = (undefined4)field_member._M_string_length;
      b = (undefined1 *)&local_580;
      local_580.piece_data_ = (char *)0x0;
      local_580.piece_size_ = CONCAT44(local_580.piece_size_._4_4_,0xffffffff);
      local_500.piece_data_ = (char *)0x0;
      local_500.piece_size_ = CONCAT44(local_500.piece_size_._4_4_,0xffffffff);
      local_4a0.piece_data_ = (pointer)0x0;
      local_4a0.piece_size_ = CONCAT44(local_4a0.piece_size_._4_4_,0xffffffff);
      local_4d0.piece_data_ = (char *)0x0;
      local_4d0.piece_size_ = CONCAT44(local_4d0.piece_size_._4_4_,0xffffffff);
      local_3c0.piece_data_ = (pointer)0x0;
      local_3c0.piece_size_ = CONCAT44(local_3c0.piece_size_._4_4_,0xffffffff);
      local_200.piece_data_ = (pointer)0x0;
      local_200.piece_size_._0_4_ = 0xffffffff;
      local_f0.piece_data_ = (char *)0x0;
      local_f0.piece_size_._0_4_ = 0xffffffff;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute((string *)&local_230,(string *)local_530,(SubstituteArg *)local_610,
                          (SubstituteArg *)b,(SubstituteArg *)&local_500,(SubstituteArg *)&local_4a0
                          ,(SubstituteArg *)&local_4d0,(SubstituteArg *)&local_3c0,
                          (SubstituteArg *)&local_200,(SubstituteArg *)&local_f0,&local_120,
                          &local_150);
      std::__cxx11::string::operator=((string *)&prepared_add_template,(string *)&local_230);
      if (local_230.text_ != local_230.scratch_ + 4) {
        operator_delete(local_230.text_);
      }
      _Var12._M_p = (pointer)local_530._0_8_;
      if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) goto LAB_002e3419;
      goto LAB_002e341e;
    }
LAB_002e2cb0:
    std::__cxx11::string::_M_replace
              ((ulong)&prepared_template,0,(char *)prepared_template._M_string_length,0x4165bf);
    psVar11 = &prepared_add_template;
LAB_002e2cdc:
    b = "nullptr";
    std::__cxx11::string::_M_replace((ulong)psVar11,0,(char *)psVar11->_M_string_length,0x4165bf);
  }
  else {
LAB_002e294d:
    if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
      local_610._0_8_ = FieldDescriptor::TypeOnceInit;
      local_580.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_610,
                 (FieldDescriptor **)&local_580);
    }
    if ((descriptor[2] == (FieldDescriptor)0xb) &&
       (bVar5 = FieldDescriptor::is_map_message_type(descriptor), bVar5)) {
LAB_002e2cd7:
      psVar11 = &prepared_template;
      goto LAB_002e2cdc;
    }
    if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
      local_610._0_8_ = FieldDescriptor::TypeOnceInit;
      local_580.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_610,
                 (FieldDescriptor **)&local_580);
    }
    if ((descriptor[2] == (FieldDescriptor)0xb) &&
       (*(char *)(*(long *)(descriptor + 0x38) + 0x4d) == '\0')) goto LAB_002e2cd7;
    if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
      local_610._0_8_ = FieldDescriptor::TypeOnceInit;
      local_580.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_610,
                 (FieldDescriptor **)&local_580);
    }
    _Var12._M_p = field_member._M_dataplus._M_p;
    b = FieldDescriptor::kTypeToCppTypeMap;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)descriptor[2] * 4) == 9) {
      if (lVar13 == 0) {
        b = (undefined1 *)
            CONCAT44(field_member._M_string_length._4_4_,(undefined4)field_member._M_string_length);
        if (field_member._M_string_length._4_4_ < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    ((size_t)b,"string length exceeds max size");
        }
        field_member_00.length_ = (size_type)pAVar14;
        field_member_00.ptr_ = b;
        (anonymous_namespace)::GenerateTemplateForSingleString_abi_cxx11_
                  ((string *)local_610,(_anonymous_namespace_ *)descriptor,
                   (FieldDescriptor *)_Var12._M_p,field_member_00);
        std::__cxx11::string::operator=((string *)&prepared_template,(string *)local_610);
        _Var12._M_p = (pointer)local_610._0_8_;
        if ((undefined1 *)local_610._0_8_ != local_610 + 0x10) goto LAB_002e3419;
      }
      else {
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"proto_ns","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)e,&local_390);
        pFVar8 = extraout_RDX_05;
        if ((long)pmVar6->_M_string_length < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (pmVar6->_M_string_length,"string length exceeds max size");
          pFVar8 = extraout_RDX_06;
        }
        uVar4 = (undefined4)field_member._M_string_length;
        _Var12._M_p = field_member._M_dataplus._M_p;
        if (field_member._M_string_length._4_4_ < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (CONCAT44(field_member._M_string_length._4_4_,
                              (undefined4)field_member._M_string_length),
                     "string length exceeds max size");
          pFVar8 = extraout_RDX_07;
        }
        FieldName_abi_cxx11_(&field_name,(cpp *)descriptor,pFVar8);
        pcVar10 = "$0";
        if (*(int *)(*(long *)(descriptor + 0x38) + 0x48) == 0) {
          pcVar10 = "$0.GetPointer()";
        }
        pcVar9 = pcVar10 + 2;
        if (*(int *)(*(long *)(descriptor + 0x38) + 0x48) == 0) {
          pcVar9 = pcVar10 + 0xf;
        }
        field_pointer._M_dataplus._M_p = (pointer)&field_pointer.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&field_pointer,pcVar10,pcVar9);
        if (*(long *)(*(long *)(descriptor + 0x40) + 8) == 0) {
          local_610._0_8_ = "_internal_has_";
          local_610._8_8_ = 0xe;
          local_580.piece_data_ = field_name._M_dataplus._M_p;
          local_580.piece_size_ = field_name._M_string_length;
          local_500.piece_data_ = "() ? ";
          local_500.piece_size_ = 5;
          local_4a0.piece_data_ = field_pointer._M_dataplus._M_p;
          local_4a0.piece_size_ = field_pointer._M_string_length;
          local_4d0.piece_data_ = ": nullptr";
          local_4d0.piece_size_ = 9;
          StrCat_abi_cxx11_((string *)&local_280,(protobuf *)local_610,&local_580,&local_500,
                            &local_4a0,&local_4d0,e);
          local_3c0.piece_data_ = _Var12._M_p;
          local_3c0.piece_size_ = CONCAT44(local_3c0.piece_size_._4_4_,uVar4);
          b = (undefined1 *)&local_200;
          local_200.piece_data_ = (pointer)0x0;
          local_200.piece_size_._0_4_ = 0xffffffff;
          local_f0.piece_data_ = (char *)0x0;
          local_f0.piece_size_._0_4_ = 0xffffffff;
          local_120.text_ = (char *)0x0;
          local_120.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          local_230.text_ = (char *)0x0;
          local_230.size_ = -1;
          local_530._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_530._8_4_ = -1;
          local_60.text_ = (char *)0x0;
          local_60.size_ = -1;
          local_90.text_ = (char *)0x0;
          local_90.size_ = -1;
          local_c0.text_ = (char *)0x0;
          local_c0.size_ = -1;
          strings::Substitute(&local_1b0,(string *)&local_280,(SubstituteArg *)&local_3c0,
                              (SubstituteArg *)b,(SubstituteArg *)&local_f0,&local_120,&local_150,
                              &local_230,(SubstituteArg *)local_530,&local_60,&local_90,&local_c0);
          _Var12._M_p = local_280.text_;
          if (local_280.text_ != local_280.scratch_ + 4) goto LAB_002e33ad;
        }
        else {
          iVar1 = *(int *)(*(long *)(descriptor + 0x38) + 0x48);
          if (iVar1 == 2) {
            local_610._0_8_ = "_internal_has_";
            local_610._8_8_ = 0xe;
            local_580.piece_data_ = field_name._M_dataplus._M_p;
            local_580.piece_size_ = field_name._M_string_length;
            local_500.piece_data_ = "() ? ";
            local_500.piece_size_ = 5;
            local_4a0.piece_data_ = field_pointer._M_dataplus._M_p;
            local_4a0.piece_size_ = field_pointer._M_string_length;
            local_4d0.piece_data_ = ": nullptr";
            local_4d0.piece_size_ = 9;
            StrCat_abi_cxx11_((string *)&local_280,(protobuf *)local_610,&local_580,&local_500,
                              &local_4a0,&local_4d0,e);
            local_3c0.piece_data_ = _Var12._M_p;
            local_3c0.piece_size_ = CONCAT44(local_3c0.piece_size_._4_4_,uVar4);
            b = (undefined1 *)&local_200;
            local_200.piece_data_ = (pointer)0x0;
            local_200.piece_size_._0_4_ = 0xffffffff;
            local_f0.piece_data_ = (char *)0x0;
            local_f0.piece_size_._0_4_ = 0xffffffff;
            local_120.text_ = (char *)0x0;
            local_120.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_230.text_ = (char *)0x0;
            local_230.size_ = -1;
            local_530._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_530._8_4_ = -1;
            local_60.text_ = (char *)0x0;
            local_60.size_ = -1;
            local_90.text_ = (char *)0x0;
            local_90.size_ = -1;
            local_c0.text_ = (char *)0x0;
            local_c0.size_ = -1;
            strings::Substitute(&local_1b0,(string *)&local_280,(SubstituteArg *)&local_3c0,
                                (SubstituteArg *)b,(SubstituteArg *)&local_f0,&local_120,&local_150,
                                &local_230,(SubstituteArg *)local_530,&local_60,&local_90,&local_c0)
            ;
            _Var12._M_p = local_280.text_;
            if (local_280.text_ != local_280.scratch_ + 4) {
LAB_002e33ad:
              operator_delete(_Var12._M_p);
            }
          }
          else {
            pcVar10 = "&$1";
            if (iVar1 == 0) {
              pcVar10 = "&$1.get()";
            }
            pcVar9 = pcVar10 + 3;
            if (iVar1 == 0) {
              pcVar9 = pcVar10 + 9;
            }
            pAVar14 = (AlphaNum *)0x2e31d3;
            default_value_pointer._M_dataplus._M_p = (pointer)&default_value_pointer.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&default_value_pointer,pcVar10,pcVar9);
            local_610._0_8_ = "_internal_has_";
            local_610._8_8_ = 0xe;
            local_580.piece_data_ = field_name._M_dataplus._M_p;
            local_580.piece_size_ = field_name._M_string_length;
            local_500.piece_data_ = "() ? ";
            local_500.piece_size_ = 5;
            local_4a0.piece_data_ = field_pointer._M_dataplus._M_p;
            local_4a0.piece_size_ = field_pointer._M_string_length;
            local_4d0.piece_data_ = " : ";
            local_4d0.piece_size_ = 3;
            local_3c0.piece_data_ = default_value_pointer._M_dataplus._M_p;
            local_3c0.piece_size_ = default_value_pointer._M_string_length;
            StrCat_abi_cxx11_(&local_170,(protobuf *)local_610,&local_580,&local_500,&local_4a0,
                              &local_4d0,&local_3c0,pAVar14);
            local_200.piece_data_ = _Var12._M_p;
            local_200.piece_size_._0_4_ = uVar4;
            MakeDefaultName_abi_cxx11_(&local_190,(cpp *)descriptor,field);
            b = (undefined1 *)&local_f0;
            local_f0.piece_data_ = local_190._M_dataplus._M_p;
            local_f0.piece_size_._0_4_ = (undefined4)local_190._M_string_length;
            local_120.text_ = (char *)0x0;
            local_120.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_230.text_ = (char *)0x0;
            local_230.size_ = -1;
            local_530._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_530._8_4_ = -1;
            local_60.text_ = (char *)0x0;
            local_60.size_ = -1;
            local_90.text_ = (char *)0x0;
            local_90.size_ = -1;
            local_c0.text_ = (char *)0x0;
            local_c0.size_ = -1;
            local_280.text_ = (pointer)0x0;
            local_280.size_ = -1;
            strings::Substitute(&local_1b0,&local_170,(SubstituteArg *)&local_200,(SubstituteArg *)b
                                ,&local_120,&local_150,&local_230,(SubstituteArg *)local_530,
                                &local_60,&local_90,&local_c0,&local_280);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p);
            }
            _Var12._M_p = default_value_pointer._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)default_value_pointer._M_dataplus._M_p != &default_value_pointer.field_2)
            goto LAB_002e33ad;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_pointer._M_dataplus._M_p != &field_pointer.field_2) {
          operator_delete(field_pointer._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field_name._M_dataplus._M_p != &field_name.field_2) {
          operator_delete(field_name._M_dataplus._M_p);
        }
        std::__cxx11::string::operator=((string *)&prepared_template,(string *)&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        _Var12._M_p = local_390._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) goto LAB_002e3419;
      }
    }
    else {
      local_610._0_8_ = "&";
      local_610._8_8_ = 1;
      local_580.piece_size_ =
           CONCAT44(field_member._M_string_length._4_4_,(undefined4)field_member._M_string_length);
      local_580.piece_data_ = field_member._M_dataplus._M_p;
      StrCat_abi_cxx11_((string *)&local_500,(protobuf *)local_610,&local_580,
                        (AlphaNum *)FieldDescriptor::kTypeToCppTypeMap);
      std::__cxx11::string::operator=((string *)&prepared_template,(string *)&local_500);
      _Var12._M_p = local_500.piece_data_;
      if (local_500.piece_data_ != local_500.digits) {
LAB_002e3419:
        operator_delete(_Var12._M_p);
      }
    }
  }
LAB_002e341e:
  if ((~(byte)descriptor[1] & 0x60) == 0) {
    if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
      local_610._0_8_ = FieldDescriptor::TypeOnceInit;
      local_580.piece_data_ = (char *)descriptor;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_610,
                 (FieldDescriptor **)&local_580);
    }
    if ((descriptor[2] != (FieldDescriptor)0xb) ||
       (bVar5 = FieldDescriptor::is_map_message_type(descriptor), !bVar5)) {
      if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
        local_610._0_8_ = FieldDescriptor::TypeOnceInit;
        local_580.piece_data_ = (char *)descriptor;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_610,
                   (FieldDescriptor **)&local_580);
      }
      if (descriptor[2] != (FieldDescriptor)0xb) {
        if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
          local_610._0_8_ = FieldDescriptor::TypeOnceInit;
          local_580.piece_data_ = (char *)descriptor;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_610
                     ,(FieldDescriptor **)&local_580);
        }
        if (descriptor[2] != (FieldDescriptor)0xa) {
          local_610._0_8_ = "&";
          local_610._8_8_ = 1;
          local_580.piece_size_ =
               CONCAT44(field_member._M_string_length._4_4_,
                        (undefined4)field_member._M_string_length);
          local_580.piece_data_ = field_member._M_dataplus._M_p;
          StrCat_abi_cxx11_((string *)&local_500,(protobuf *)local_610,&local_580,(AlphaNum *)b);
          std::__cxx11::string::operator=((string *)&prepared_flat_template,(string *)&local_500);
          if (local_500.piece_data_ != local_500.digits) {
            operator_delete(local_500.piece_data_);
          }
          goto LAB_002e34e2;
        }
      }
    }
  }
  std::__cxx11::string::_M_assign((string *)&prepared_flat_template);
LAB_002e34e2:
  substitute_template_prefix_00.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_00.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_template._M_string_length;
  local_3d0 = prepared_template._M_dataplus._M_p;
  sStack_3c8 = 0;
  if ((long)prepared_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_template._M_string_length,"string length exceeds max size");
  }
  sStack_3c8 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_00.length_ = sVar3;
  prepared_template_00.ptr_ = local_3d0;
  access_type.length_ = 5;
  access_type.ptr_ = "OnGet";
  annotation_name.length_ = 3;
  annotation_name.ptr_ = "get";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name,substitute_template_prefix_00,prepared_template_00,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  substitute_template_prefix_01.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_01.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_template._M_string_length;
  local_3e0 = prepared_template._M_dataplus._M_p;
  sStack_3d8 = 0;
  if ((long)prepared_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_template._M_string_length,"string length exceeds max size");
  }
  sStack_3d8 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_01.length_ = sVar3;
  prepared_template_01.ptr_ = local_3e0;
  access_type_00.length_ = 5;
  access_type_00.ptr_ = "OnSet";
  annotation_name_00.length_ = 3;
  annotation_name_00.ptr_ = "set";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_00,substitute_template_prefix_01,prepared_template_01,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type_00,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  substitute_template_prefix_02.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_02.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_template._M_string_length;
  local_3f0 = prepared_template._M_dataplus._M_p;
  sStack_3e8 = 0;
  if ((long)prepared_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_template._M_string_length,"string length exceeds max size");
  }
  sStack_3e8 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_02.length_ = sVar3;
  prepared_template_02.ptr_ = local_3f0;
  access_type_01.length_ = 5;
  access_type_01.ptr_ = "OnHas";
  annotation_name_01.length_ = 3;
  annotation_name_01.ptr_ = "has";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_01,substitute_template_prefix_02,prepared_template_02,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type_01,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  substitute_template_prefix_03.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_03.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_template._M_string_length;
  local_400 = prepared_template._M_dataplus._M_p;
  sStack_3f8 = 0;
  if ((long)prepared_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_template._M_string_length,"string length exceeds max size");
  }
  sStack_3f8 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_03.length_ = sVar3;
  prepared_template_03.ptr_ = local_400;
  access_type_02.length_ = 9;
  access_type_02.ptr_ = "OnMutable";
  annotation_name_02.length_ = 7;
  annotation_name_02.ptr_ = "mutable";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_02,substitute_template_prefix_03,prepared_template_03,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type_02,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  substitute_template_prefix_04.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_04.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_template._M_string_length;
  local_410 = prepared_template._M_dataplus._M_p;
  sStack_408 = 0;
  if ((long)prepared_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_template._M_string_length,"string length exceeds max size");
  }
  sStack_408 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_04.length_ = sVar3;
  prepared_template_04.ptr_ = local_410;
  access_type_03.length_ = 9;
  access_type_03.ptr_ = "OnRelease";
  annotation_name_03.length_ = 7;
  annotation_name_03.ptr_ = "release";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_03,substitute_template_prefix_04,prepared_template_04,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type_03,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  substitute_template_prefix_05.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_05.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_flat_template._M_string_length;
  local_420 = prepared_flat_template._M_dataplus._M_p;
  sStack_418 = 0;
  if ((long)prepared_flat_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_flat_template._M_string_length,"string length exceeds max size");
  }
  sStack_418 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_05.length_ = sVar3;
  prepared_template_05.ptr_ = local_420;
  access_type_04.length_ = 7;
  access_type_04.ptr_ = "OnClear";
  annotation_name_04.length_ = 5;
  annotation_name_04.ptr_ = "clear";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_04,substitute_template_prefix_05,prepared_template_05,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type_04,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  substitute_template_prefix_06.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_06.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_flat_template._M_string_length;
  local_430 = prepared_flat_template._M_dataplus._M_p;
  sStack_428 = 0;
  if ((long)prepared_flat_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_flat_template._M_string_length,"string length exceeds max size");
  }
  sStack_428 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_06.length_ = sVar3;
  prepared_template_06.ptr_ = local_430;
  access_type_05.length_ = 6;
  access_type_05.ptr_ = "OnSize";
  annotation_name_05.length_ = 4;
  annotation_name_05.ptr_ = "size";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_05,substitute_template_prefix_06,prepared_template_06,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type_05,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  substitute_template_prefix_07.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_07.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_flat_template._M_string_length;
  local_440 = prepared_flat_template._M_dataplus._M_p;
  sStack_438 = 0;
  if ((long)prepared_flat_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_flat_template._M_string_length,"string length exceeds max size");
  }
  sStack_438 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_07.length_ = sVar3;
  prepared_template_07.ptr_ = local_440;
  access_type_06.length_ = 6;
  access_type_06.ptr_ = "OnList";
  annotation_name_06.length_ = 4;
  annotation_name_06.ptr_ = "list";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_06,substitute_template_prefix_07,prepared_template_07,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type_06,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  substitute_template_prefix_08.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_08.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_flat_template._M_string_length;
  local_450 = prepared_flat_template._M_dataplus._M_p;
  sStack_448 = 0;
  if ((long)prepared_flat_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_flat_template._M_string_length,"string length exceeds max size");
  }
  sStack_448 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_08.length_ = sVar3;
  prepared_template_08.ptr_ = local_450;
  access_type_07.length_ = 0xd;
  access_type_07.ptr_ = "OnMutableList";
  annotation_name_07.length_ = 0xc;
  annotation_name_07.ptr_ = "mutable_list";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_07,substitute_template_prefix_08,prepared_template_08,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type_07,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  substitute_template_prefix_09.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_09.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_add_template._M_string_length;
  local_460 = prepared_add_template._M_dataplus._M_p;
  sStack_458 = 0;
  if ((long)prepared_add_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_add_template._M_string_length,"string length exceeds max size");
  }
  sStack_458 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_09.length_ = sVar3;
  prepared_template_09.ptr_ = local_460;
  access_type_08.length_ = 5;
  access_type_08.ptr_ = "OnAdd";
  annotation_name_08.length_ = 3;
  annotation_name_08.ptr_ = "add";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_08,substitute_template_prefix_09,prepared_template_09,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type_08,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  substitute_template_prefix_10.length_ = substitute_template_prefix._M_string_length;
  substitute_template_prefix_10.ptr_ = substitute_template_prefix._M_dataplus._M_p;
  if ((long)substitute_template_prefix._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (substitute_template_prefix._M_string_length,"string length exceeds max size");
  }
  sVar3 = prepared_add_template._M_string_length;
  local_470 = prepared_add_template._M_dataplus._M_p;
  sStack_468 = 0;
  if ((long)prepared_add_template._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (prepared_add_template._M_string_length,"string length exceeds max size");
  }
  sStack_468 = sVar3;
  if (((byte)descriptor[1] & 8) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x20) + 0x28);
  }
  else if (*(long *)(descriptor + 0x28) == 0) {
    plVar7 = (long *)(*(long *)(descriptor + 0x10) + 0x70);
  }
  else {
    plVar7 = (long *)(*(long *)(descriptor + 0x28) + 0x50);
  }
  prepared_template_10.length_ = sVar3;
  prepared_template_10.ptr_ = local_470;
  access_type_09.length_ = 0xc;
  access_type_09.ptr_ = "OnAddMutable";
  annotation_name_09.length_ = 0xb;
  annotation_name_09.ptr_ = "add_mutable";
  anon_unknown_7::MaySetAnnotationVariable
            (options,annotation_name_09,substitute_template_prefix_10,prepared_template_10,
             (int)((ulong)((long)descriptor - *plVar7) >> 3) * 0x38e38e39,access_type_09,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prepared_add_template._M_dataplus._M_p != &prepared_add_template.field_2) {
    operator_delete(prepared_add_template._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prepared_flat_template._M_dataplus._M_p != &prepared_flat_template.field_2) {
    operator_delete(prepared_flat_template._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prepared_template._M_dataplus._M_p != &prepared_template.field_2) {
    operator_delete(prepared_template._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)substitute_template_prefix._M_dataplus._M_p != &substitute_template_prefix.field_2) {
    operator_delete(substitute_template_prefix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)proto_ns._M_dataplus._M_p != &proto_ns.field_2) {
    operator_delete(proto_ns._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_member._M_dataplus._M_p != &field_member.field_2) {
    operator_delete(field_member._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AddAccessorAnnotations(const FieldDescriptor* descriptor,
                            const Options& options,
                            std::map<std::string, std::string>* variables) {
  // Can be expanded to include more specific calls, for example, for arena or
  // clear calls.
  static constexpr const char* kAccessorsAnnotations[] = {
      "annotate_add",     "annotate_get",         "annotate_has",
      "annotate_list",    "annotate_mutable",     "annotate_mutable_list",
      "annotate_release", "annotate_set",         "annotate_size",
      "annotate_clear",   "annotate_add_mutable",
  };
  for (size_t i = 0; i < GOOGLE_ARRAYSIZE(kAccessorsAnnotations); ++i) {
    (*variables)[kAccessorsAnnotations[i]] = "";
  }
  if (options.annotate_accessor) {
    for (size_t i = 0; i < GOOGLE_ARRAYSIZE(kAccessorsAnnotations); ++i) {
      (*variables)[kAccessorsAnnotations[i]] = StrCat(
          "  ", FieldName(descriptor), "_AccessedNoStrip = true;\n");
    }
  }
  if (!options.field_listener_options.inject_field_listener_events) {
    return;
  }
  if (descriptor->file()->options().optimize_for() ==
      google::protobuf::FileOptions::LITE_RUNTIME) {
    return;
  }
  std::string field_member = (*variables)["field_member"];
  const google::protobuf::OneofDescriptor* oneof_member =
      descriptor->real_containing_oneof();
  if (oneof_member) {
    field_member = StrCat(oneof_member->name(), "_.", field_member);
  }
  const std::string proto_ns = (*variables)["proto_ns"];
  const std::string substitute_template_prefix = "  _tracker_.$1<$0>(this, ";
  std::string prepared_template;

  // Flat template is needed if the prepared one is introspecting the values
  // inside the returned values, for example, for repeated fields and maps.
  std::string prepared_flat_template;
  std::string prepared_add_template;
  // TODO(b/190614678): Support fields with type Message or Map.
  if (descriptor->is_repeated() && !descriptor->is_map()) {
    if (descriptor->type() != FieldDescriptor::TYPE_MESSAGE &&
        descriptor->type() != FieldDescriptor::TYPE_GROUP) {
      prepared_template = strings::Substitute("&$0.Get(index)", field_member);
      prepared_add_template =
          strings::Substitute("&$0.Get($0.size() - 1)", field_member);
    } else {
      prepared_template = "nullptr";
      prepared_add_template = "nullptr";
    }
  } else if (descriptor->is_map()) {
    prepared_template = "nullptr";
  } else if (descriptor->type() == FieldDescriptor::TYPE_MESSAGE &&
             !descriptor->options().lazy()) {
    prepared_template = "nullptr";
  } else if (descriptor->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    if (oneof_member) {
      prepared_template = GenerateTemplateForOneofString(
          descriptor, (*variables)["proto_ns"], field_member);
    } else {
      prepared_template =
          GenerateTemplateForSingleString(descriptor, field_member);
    }
  } else {
    prepared_template = StrCat("&", field_member);
  }
  if (descriptor->is_repeated() && !descriptor->is_map() &&
      descriptor->type() != FieldDescriptor::TYPE_MESSAGE &&
      descriptor->type() != FieldDescriptor::TYPE_GROUP) {
    prepared_flat_template = StrCat("&", field_member);
  } else {
    prepared_flat_template = prepared_template;
  }

  MaySetAnnotationVariable(options, "get", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnGet",
                           variables);
  MaySetAnnotationVariable(options, "set", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnSet",
                           variables);
  MaySetAnnotationVariable(options, "has", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnHas",
                           variables);
  MaySetAnnotationVariable(options, "mutable", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnMutable",
                           variables);
  MaySetAnnotationVariable(options, "release", substitute_template_prefix,
                           prepared_template, descriptor->index(), "OnRelease",
                           variables);
  MaySetAnnotationVariable(options, "clear", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnClear", variables);
  MaySetAnnotationVariable(options, "size", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnSize", variables);
  MaySetAnnotationVariable(options, "list", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnList", variables);
  MaySetAnnotationVariable(options, "mutable_list", substitute_template_prefix,
                           prepared_flat_template, descriptor->index(),
                           "OnMutableList", variables);
  MaySetAnnotationVariable(options, "add", substitute_template_prefix,
                           prepared_add_template, descriptor->index(), "OnAdd",
                           variables);
  MaySetAnnotationVariable(options, "add_mutable", substitute_template_prefix,
                           prepared_add_template, descriptor->index(),
                           "OnAddMutable", variables);
}